

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::accessChainLoad(Builder *this,Decoration precision,Id resultType)

{
  int iVar1;
  bool bVar2;
  Id IVar3;
  size_type sVar4;
  reference pvVar5;
  Id local_6c;
  Id local_60;
  Id swizzledType;
  Id lValue;
  int local_48;
  byte local_41;
  int i;
  bool constant;
  Vector<unsigned_int> indexes;
  Id swizzleBase;
  Id id;
  Id resultType_local;
  Decoration precision_local;
  Builder *this_local;
  
  if (((this->accessChain).isRValue & 1U) == 0) {
    transferAccessChainSwizzle(this,true);
    IVar3 = collapseAccessChain(this);
    indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = createLoad(this,IVar3);
    setPrecision(this,indexes.
                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,precision);
  }
  else {
    transferAccessChainSwizzle(this,false);
    sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      (&(this->accessChain).indexChain);
    if (sVar4 == 0) {
      indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->accessChain).base;
    }
    else {
      local_6c = resultType;
      if ((this->accessChain).preSwizzleBaseType != 0) {
        local_6c = (this->accessChain).preSwizzleBaseType;
      }
      indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_6c;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&i);
      local_41 = 1;
      for (local_48 = 0; iVar1 = local_48,
          sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                            (&(this->accessChain).indexChain), iVar1 < (int)sVar4;
          local_48 = local_48 + 1) {
        pvVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[](&(this->accessChain).indexChain,(long)local_48);
        bVar2 = isConstantScalar(this,*pvVar5);
        if (!bVar2) {
          local_41 = 0;
          break;
        }
        pvVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[](&(this->accessChain).indexChain,(long)local_48);
        swizzledType = getConstantScalar(this,*pvVar5);
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&i,
                   &swizzledType);
      }
      if ((local_41 & 1) == 0) {
        IVar3 = getTypeId(this,(this->accessChain).base);
        IVar3 = createVariable(this,StorageClassFunction,IVar3,"indexable");
        createStore(this,(this->accessChain).base,IVar3);
        (this->accessChain).base = IVar3;
        (this->accessChain).isRValue = false;
        IVar3 = collapseAccessChain(this);
        indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = createLoad(this,IVar3);
      }
      else {
        indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             createCompositeExtract
                       (this,(this->accessChain).base,
                        (Id)indexes.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (Vector<unsigned_int> *)&i);
      }
      setPrecision(this,indexes.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,precision);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&i);
    }
  }
  sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if ((sVar4 == 0) && ((this->accessChain).component == 0)) {
    this_local._4_4_ =
         indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  else {
    sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if (sVar4 != 0) {
      IVar3 = getTypeId(this,indexes.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      local_60 = getScalarTypeId(this,IVar3);
      sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                        (&(this->accessChain).swizzle);
      if (1 < sVar4) {
        sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                          (&(this->accessChain).swizzle);
        local_60 = makeVectorType(this,local_60,(int)sVar4);
      }
      indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           createRvalueSwizzle(this,precision,local_60,
                               indexes.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               &(this->accessChain).swizzle);
    }
    if ((this->accessChain).component != 0) {
      IVar3 = createVectorExtractDynamic
                        (this,indexes.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,resultType,
                         (this->accessChain).component);
      indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = setPrecision(this,IVar3,precision);
    }
    this_local._4_4_ =
         indexes.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::accessChainLoad(Decoration precision, Id resultType)
{
    Id id;

    if (accessChain.isRValue) {
        // transfer access chain, but keep it static, so we can stay in registers
        transferAccessChainSwizzle(false);
        if (accessChain.indexChain.size() > 0) {
            Id swizzleBase = accessChain.preSwizzleBaseType != NoType ? accessChain.preSwizzleBaseType : resultType;

            // if all the accesses are constants, we can use OpCompositeExtract
            dxil_spv::Vector<unsigned> indexes;
            bool constant = true;
            for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
                if (isConstantScalar(accessChain.indexChain[i]))
                    indexes.push_back(getConstantScalar(accessChain.indexChain[i]));
                else {
                    constant = false;
                    break;
                }
            }

            if (constant)
                id = createCompositeExtract(accessChain.base, swizzleBase, indexes);
            else {
                // make a new function variable for this r-value
                Id lValue = createVariable(StorageClassFunction, getTypeId(accessChain.base), "indexable");

                // store into it
                createStore(accessChain.base, lValue);

                // move base to the new variable
                accessChain.base = lValue;
                accessChain.isRValue = false;

                // load through the access chain
                id = createLoad(collapseAccessChain());
            }
            setPrecision(id, precision);
        } else
            id = accessChain.base;  // no precision, it was set when this was defined
    } else {
        transferAccessChainSwizzle(true);
        // load through the access chain
        id = createLoad(collapseAccessChain());
        setPrecision(id, precision);
    }

    // Done, unless there are swizzles to do
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return id;

    // Do remaining swizzling
    // First, static swizzling
    if (accessChain.swizzle.size()) {
        // static swizzle
        Id swizzledType = getScalarTypeId(getTypeId(id));
        if (accessChain.swizzle.size() > 1)
            swizzledType = makeVectorType(swizzledType, (int)accessChain.swizzle.size());
        id = createRvalueSwizzle(precision, swizzledType, id, accessChain.swizzle);
    }

    // dynamic single-component selection
    if (accessChain.component != NoResult)
        id = setPrecision(createVectorExtractDynamic(id, resultType, accessChain.component), precision);

    return id;
}